

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

text_fit ON_DimStyle::TextFitFromUnsigned(uint text_fit_as_unsigned)

{
  if (5 < text_fit_as_unsigned) {
    text_fit_as_unsigned = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x208,"","invalid text_fit_as_unsigned parameter.");
  }
  return (text_fit)text_fit_as_unsigned;
}

Assistant:

ON_DimStyle::text_fit ON_DimStyle::TextFitFromUnsigned(
  unsigned int text_fit_as_unsigned
)
{
  switch (text_fit_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::Auto);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextInside);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextRight);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextLeft);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextHintRight);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextHintLeft);
  }
  ON_ERROR("invalid text_fit_as_unsigned parameter.");
  return (ON_DimStyle::text_fit::Auto);
}